

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O0

void __thiscall
Assimp::X3DExporter::AttrHelper_Vec3DAsVec2fArrToString
          (X3DExporter *this,aiVector3D *pArray,size_t pArray_Size,string *pTargetString)

{
  size_t sVar1;
  string local_e0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string *local_30;
  size_t idx;
  string *pTargetString_local;
  size_t pArray_Size_local;
  aiVector3D *pArray_local;
  X3DExporter *this_local;
  
  idx = (size_t)pTargetString;
  pTargetString_local = (string *)pArray_Size;
  pArray_Size_local = (size_t)pArray;
  pArray_local = (aiVector3D *)this;
  std::__cxx11::string::clear();
  std::__cxx11::string::reserve(idx);
  for (local_30 = (string *)0x0; sVar1 = idx, local_30 < pTargetString_local;
      local_30 = (string *)&local_30->field_0x1) {
    std::__cxx11::to_string(&local_b0,*(float *)(pArray_Size_local + (long)local_30 * 0xc));
    std::operator+(&local_90,&local_b0," ");
    std::__cxx11::to_string(&local_e0,*(float *)(pArray_Size_local + 4 + (long)local_30 * 0xc));
    std::operator+(&local_70,&local_90,&local_e0);
    std::operator+(&local_50,&local_70," ");
    std::__cxx11::string::append((string *)sVar1);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  std::__cxx11::string::length();
  std::__cxx11::string::resize(sVar1);
  AttrHelper_CommaToPoint(this,(string *)idx);
  return;
}

Assistant:

void X3DExporter::AttrHelper_Vec3DAsVec2fArrToString(const aiVector3D* pArray, const size_t pArray_Size, string& pTargetString)
{
	pTargetString.clear();
	pTargetString.reserve(pArray_Size * 4);// (Number + space) * 2.
	for(size_t idx = 0; idx < pArray_Size; idx++)
		pTargetString.append(to_string(pArray[idx].x) + " " + to_string(pArray[idx].y) + " ");

	// remove last space symbol.
	pTargetString.resize(pTargetString.length() - 1);
	AttrHelper_CommaToPoint(pTargetString);
}